

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::
compare(InvariantOuterTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int outerEdgeNdx)

{
  TestContext *pTVar1;
  TestLog *pTVar2;
  reference pvVar3;
  char *pcVar4;
  vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  local_f0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  IsQuadTriangleOnOuterEdge local_98 [4];
  vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  local_88;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IsTriangleTriangleOnOuterEdge local_30;
  int local_2c;
  PerPrimitiveVec *pPStack_28;
  int outerEdgeNdx_local;
  PerPrimitiveVec *primitivesB_local;
  PerPrimitiveVec *primitivesA_local;
  InvariantOuterTriangleSetTestInstance *this_local;
  
  local_2c = outerEdgeNdx;
  pPStack_28 = primitivesB;
  primitivesB_local = primitivesA;
  primitivesA_local = (PerPrimitiveVec *)this;
  if ((this->super_InvarianceTestInstance).m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    pTVar1 = Context::getTestContext
                       ((this->super_InvarianceTestInstance).super_TestInstance.m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    IsTriangleTriangleOnOuterEdge::IsTriangleTriangleOnOuterEdge(&local_30,local_2c);
    outerEdgeDescriptions(&local_88,(this->super_InvarianceTestInstance).m_caseDef.primitiveType);
    pvVar3 = std::
             vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
             ::operator[](&local_88,(long)local_2c);
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_70,pvVar3);
    std::operator+(&local_50,
                   "inner triangles, and outer triangles corresponding to other edge than edge ",
                   &local_70);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ =
         compareTriangleSets<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::IsTriangleTriangleOnOuterEdge>
                   (primitivesA,primitivesB,pTVar2,&local_30,pcVar4);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
    ::~vector(&local_88);
  }
  else if ((this->super_InvarianceTestInstance).m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
  {
    pTVar1 = Context::getTestContext
                       ((this->super_InvarianceTestInstance).super_TestInstance.m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    IsQuadTriangleOnOuterEdge::IsQuadTriangleOnOuterEdge(local_98,local_2c);
    outerEdgeDescriptions(&local_f0,(this->super_InvarianceTestInstance).m_caseDef.primitiveType);
    pvVar3 = std::
             vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
             ::operator[](&local_f0,(long)local_2c);
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_d8,pvVar3);
    std::operator+(&local_b8,
                   "inner triangles, and outer triangles corresponding to other edge than edge ",
                   &local_d8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ =
         compareTriangleSets<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::IsQuadTriangleOnOuterEdge>
                   (primitivesA,primitivesB,pTVar2,local_98,pcVar4);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
    ::~vector(&local_f0);
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int outerEdgeNdx) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsTriangleTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsQuadTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else
			DE_ASSERT(false);

		return true;
	}